

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5ExprNodeNext_OR(Fts5Expr *pExpr,Fts5ExprNode *pNode,int bFromValid,i64 iFrom)

{
  long lVar1;
  Fts5ExprNode *pFVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = pNode->nChild;
  if (0 < iVar4) {
    lVar1 = pNode->iRowid;
    lVar5 = 0;
    do {
      pFVar2 = pNode->apChild[lVar5];
      if (pFVar2->bEof == 0) {
        lVar3 = pFVar2->iRowid;
        if (lVar3 == lVar1) goto LAB_001df950;
        if (bFromValid != 0) {
          if (pExpr->bDesc == 0) {
            if (lVar3 < iFrom) goto LAB_001df950;
          }
          else if (iFrom < lVar3) {
LAB_001df950:
            iVar4 = (*pFVar2->xNext)(pExpr,pFVar2,bFromValid,iFrom);
            if (iVar4 != 0) {
              pNode->bNomatch = 0;
              return iVar4;
            }
            iVar4 = pNode->nChild;
          }
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar4);
  }
  fts5ExprNodeTest_OR(pExpr,pNode);
  return 0;
}

Assistant:

static int fts5ExprNodeNext_OR(
  Fts5Expr *pExpr,
  Fts5ExprNode *pNode,
  int bFromValid,
  i64 iFrom
){
  int i;
  i64 iLast = pNode->iRowid;

  for(i=0; i<pNode->nChild; i++){
    Fts5ExprNode *p1 = pNode->apChild[i];
    assert( p1->bEof || fts5RowidCmp(pExpr, p1->iRowid, iLast)>=0 );
    if( p1->bEof==0 ){
      if( (p1->iRowid==iLast)
       || (bFromValid && fts5RowidCmp(pExpr, p1->iRowid, iFrom)<0)
      ){
        int rc = fts5ExprNodeNext(pExpr, p1, bFromValid, iFrom);
        if( rc!=SQLITE_OK ){
          pNode->bNomatch = 0;
          return rc;
        }
      }
    }
  }

  fts5ExprNodeTest_OR(pExpr, pNode);
  return SQLITE_OK;
}